

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall pg::Game::permute(Game *this,int *mapping)

{
  long lVar1;
  
  unsafe_permute(this,mapping);
  this->is_ordered = true;
  if (1 < this->n_vertices) {
    lVar1 = 1;
    do {
      if (this->_priority[lVar1] < this->_priority[lVar1 + -1]) {
        this->is_ordered = false;
        return;
      }
      lVar1 = lVar1 + 1;
    } while (this->n_vertices != lVar1);
  }
  return;
}

Assistant:

void
Game::permute(int *mapping)
{
    unsafe_permute(mapping);

    // check if ordered...
    is_ordered = true;
    for (int i=1; i<n_vertices; i++) {
        if (_priority[i-1] > _priority[i]) {
            is_ordered = false;
            break;
        }
    }
}